

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svgparser.cpp
# Opt level: O0

bool lunasvg::parseSimpleSelector(string_view *input,SimpleSelector *simpleSelector,bool *failed)

{
  bool bVar1;
  undefined1 local_22;
  undefined1 local_21;
  bool consumed;
  bool *failed_local;
  SimpleSelector *simpleSelector_local;
  string_view *input_local;
  
  local_21 = parseTagSelector(input,simpleSelector);
  do {
    bVar1 = skipDelimiter(input,'#');
    if (bVar1) {
      bVar1 = parseIdSelector(input,simpleSelector);
      *failed = (bool)((bVar1 ^ 0xffU) & 1);
    }
    else {
      bVar1 = skipDelimiter(input,'.');
      if (bVar1) {
        bVar1 = parseClassSelector(input,simpleSelector);
        *failed = (bool)((bVar1 ^ 0xffU) & 1);
      }
      else {
        bVar1 = skipDelimiter(input,'[');
        if (bVar1) {
          bVar1 = parseAttributeSelector(input,simpleSelector);
          *failed = (bool)((bVar1 ^ 0xffU) & 1);
        }
        else {
          bVar1 = skipDelimiter(input,':');
          if (!bVar1) break;
          bVar1 = parsePseudoClassSelector(input,simpleSelector);
          *failed = (bool)((bVar1 ^ 0xffU) & 1);
        }
      }
    }
    local_21 = true;
  } while (((*failed ^ 0xffU) & 1) != 0);
  local_22 = 0;
  if (local_21 != false) {
    local_22 = *failed ^ 0xff;
  }
  return (bool)(local_22 & 1);
}

Assistant:

static bool parseSimpleSelector(std::string_view& input, SimpleSelector& simpleSelector, bool& failed)
{
    auto consumed = parseTagSelector(input, simpleSelector);
    do {
        if(skipDelimiter(input, '#'))
            failed = !parseIdSelector(input, simpleSelector);
        else if(skipDelimiter(input, '.'))
            failed = !parseClassSelector(input, simpleSelector);
        else if(skipDelimiter(input, '['))
            failed = !parseAttributeSelector(input, simpleSelector);
        else if(skipDelimiter(input, ':'))
            failed = !parsePseudoClassSelector(input, simpleSelector);
        else
            break;
        consumed = true;
    } while(!failed);
    return consumed && !failed;
}